

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.c
# Opt level: O2

void pmsav7_rgnr_write(CPUARMState_conflict *env,ARMCPRegInfo_conflict *ri,uint64_t value)

{
  long lVar1;
  
  if (*(uint *)((long)env[1].xregs + 0x1c) <= value) {
    return;
  }
  lVar1 = ri->fieldoffset;
  if (lVar1 != 0) {
    if ((ri->state != 1) && ((ri->type & 4) == 0)) {
      *(int *)((long)env->regs + lVar1) = (int)value;
      return;
    }
    *(uint64_t *)((long)env->regs + lVar1) = value;
    return;
  }
  __assert_fail("ri->fieldoffset",
                "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/arm/helper.c"
                ,0x35,"void raw_write(CPUARMState *, const ARMCPRegInfo *, uint64_t)");
}

Assistant:

static void pmsav7_rgnr_write(CPUARMState *env, const ARMCPRegInfo *ri,
                              uint64_t value)
{
    ARMCPU *cpu = env_archcpu(env);
    uint32_t nrgs = cpu->pmsav7_dregion;

    if (value >= nrgs) {
        qemu_log_mask(LOG_GUEST_ERROR,
                      "PMSAv7 RGNR write >= # supported regions, %" PRIu32
                      " > %" PRIu32 "\n", (uint32_t)value, nrgs);
        return;
    }

    raw_write(env, ri, value);
}